

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O0

void __thiscall CItems::RenderProjectile(CItems *this,CNetObj_Projectile *pCurrent,int ItemID)

{
  vec2 Pos_00;
  vec2 Pos_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  IClient *pIVar4;
  CConfig *pCVar5;
  IGraphics *pIVar6;
  CRenderTools *this_00;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar7;
  float fVar8;
  float fVar9;
  float Now;
  float Ct;
  float Speed;
  float Curvature;
  CQuadItem QuadItem;
  vec2 Vel;
  vec2 PrevPos;
  vec2 Pos;
  vec2 StartVel;
  vec2 StartPos;
  CGameClient *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vector2_base<float> *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  vec2 in_stack_ffffffffffffff08;
  vec2 in_stack_ffffffffffffff10;
  CDataContainer **pSpr;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffff48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffff4c;
  float local_a8;
  vec2 in_stack_ffffffffffffff60;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffff68;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar10;
  CQuadItem local_78;
  vec2 local_68;
  vec2 local_60;
  vector2_base<float> local_54;
  int local_4c;
  vector2_base<float> local_48;
  vector2_base<float> local_40;
  vec2 local_38;
  vector2_base<float> local_30;
  vector2_base<float> local_28;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_1c;
  vector2_base<float> local_18;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar10.y = 0.0;
  if (in_RSI[4] == 3) {
    CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd84));
    aVar10.y = CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd88));
  }
  else if (in_RSI[4] == 2) {
    CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd74));
    aVar10.y = CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd78));
  }
  else if (in_RSI[4] == 1) {
    CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd68));
    aVar10.y = CTuneParam::operator_cast_to_float((CTuneParam *)(*(long *)(in_RDI + 8) + 0xd6c));
  }
  if ((RenderProjectile(CNetObj_Projectile_const*,int)::s_LastGameTickTime == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderProjectile(CNetObj_Projectile_const*,int)::
                                   s_LastGameTickTime), iVar2 != 0)) {
    pIVar4 = CComponent::Client((CComponent *)0x16cbfd);
    RenderProjectile::s_LastGameTickTime = IClient::GameTickTime(pIVar4);
    __cxa_guard_release(&RenderProjectile(CNetObj_Projectile_const*,int)::s_LastGameTickTime);
  }
  bVar1 = CGameClient::IsWorldPaused(*(CGameClient **)(in_RDI + 8));
  if ((!bVar1) &&
     (bVar1 = CGameClient::IsDemoPlaybackPaused
                        ((CGameClient *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)), !bVar1)) {
    pIVar4 = CComponent::Client((CComponent *)0x16cc5e);
    RenderProjectile::s_LastGameTickTime = IClient::GameTickTime(pIVar4);
  }
  bVar1 = CGameClient::ShouldUsePredicted
                    ((CGameClient *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if ((bVar1) &&
     (pCVar5 = CComponent::Config((CComponent *)0x16ccb1), pCVar5->m_ClPredictProjectiles != 0)) {
    pIVar4 = CComponent::Client((CComponent *)0x16ccc1);
    iVar3 = IClient::PredGameTick(pIVar4);
    iVar2 = in_RSI[5];
    pIVar4 = CComponent::Client((CComponent *)0x16cceb);
    fVar7 = IClient::PredIntraGameTick(pIVar4);
    local_a8 = ((float)((iVar3 + -1) - iVar2) + fVar7) / 50.0;
  }
  else {
    pIVar4 = CComponent::Client((CComponent *)0x16cd1e);
    iVar2 = IClient::PrevGameTick(pIVar4);
    local_a8 = (float)(iVar2 - in_RSI[5]) / 50.0 + RenderProjectile::s_LastGameTickTime;
  }
  if ((0.0 <= local_a8) || (-RenderProjectile::s_LastGameTickTime / 2.0 < local_a8)) {
    vector2_base<float>::vector2_base(&local_10,(float)*in_RSI,(float)in_RSI[1]);
    vector2_base<float>::vector2_base(&local_18,(float)in_RSI[2] / 100.0,(float)in_RSI[3] / 100.0);
    local_28 = local_10;
    local_30 = local_18;
    _local_20 = CalcPos(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                        (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    local_40 = local_10;
    local_48 = local_18;
    local_38 = CalcPos(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
                       ,in_stack_ffffffffffffff00,(float)((ulong)in_stack_fffffffffffffef8 >> 0x20))
    ;
    pIVar6 = CComponent::Graphics((CComponent *)0x16ceaa);
    pSpr = &g_pData;
    local_4c = g_pData->m_aImages[1].m_Id.m_Id;
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])();
    pIVar6 = CComponent::Graphics((CComponent *)0x16cee7);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x17])();
    this_00 = CComponent::RenderTools((CComponent *)0x16cf00);
    clamp<int>(in_RSI[4],0,5);
    CRenderTools::SelectSprite
              (this_00,(CDataSprite *)pSpr,(int)in_stack_ffffffffffffff08.field_1,
               (int)in_stack_ffffffffffffff08.field_0,(int)in_stack_ffffffffffffff04);
    local_54 = vector2_base<float>::operator-
                         ((vector2_base<float> *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8);
    if (in_RSI[4] == 3) {
      local_60 = _local_20;
      vector2_base<float>::operator*
                ((vector2_base<float> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      Pos_01.field_1 = aVar10;
      Pos_01.field_0 = in_stack_ffffffffffffff68;
      CEffects::SmokeTrail
                ((CEffects *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),Pos_01,
                 in_stack_ffffffffffffff60);
      pIVar4 = CComponent::Client((CComponent *)0x16cff2);
      fVar7 = IClient::LocalTime(pIVar4);
      if ((RenderProjectile(CNetObj_Projectile_const*,int)::s_LastLocalTime == '\0') &&
         (iVar2 = __cxa_guard_acquire(&RenderProjectile(CNetObj_Projectile_const*,int)::
                                       s_LastLocalTime), iVar2 != 0)) {
        RenderProjectile::s_LastLocalTime = fVar7;
        __cxa_guard_release(&RenderProjectile(CNetObj_Projectile_const*,int)::s_LastLocalTime);
      }
      fVar8 = fVar7 - RenderProjectile::s_LastLocalTime;
      fVar9 = CGameClient::GetAnimationPlaybackSpeed(in_stack_fffffffffffffee8);
      RenderProjectile::s_Time = fVar8 * fVar9 + RenderProjectile::s_Time;
      pIVar6 = CComponent::Graphics((CComponent *)0x16d081);
      fVar8 = RenderProjectile::s_Time * 3.1415927 * 2.0;
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x19])
                ((ulong)(uint)(fVar8 + fVar8 + (float)in_EDX));
      RenderProjectile::s_LastLocalTime = fVar7;
    }
    else {
      local_68 = _local_20;
      Pos_00.field_1 = in_stack_ffffffffffffff4c;
      Pos_00.field_0 = in_stack_ffffffffffffff48;
      CEffects::BulletTrail
                ((CEffects *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),Pos_00);
      pIVar6 = CComponent::Graphics((CComponent *)0x16d105);
      fVar7 = length((vector2_base<float> *)0x16d117);
      if (fVar7 <= 1e-05) {
        fVar7 = 0.0;
      }
      else {
        fVar7 = angle((vector2_base<float> *)0x16d131);
      }
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x19])((ulong)(uint)fVar7);
    }
    IGraphics::CQuadItem::CQuadItem(&local_78,local_20.x,aStack_1c.y,32.0,32.0);
    pIVar6 = CComponent::Graphics((CComponent *)0x16d18c);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x1c])(pIVar6,&local_78,1);
    pIVar6 = CComponent::Graphics((CComponent *)0x16d1af);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x19])(0);
    pIVar6 = CComponent::Graphics((CComponent *)0x16d1c8);
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x18])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderProjectile(const CNetObj_Projectile *pCurrent, int ItemID)
{
	// get positions
	float Curvature = 0;
	float Speed = 0;
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		Curvature = m_pClient->m_Tuning.m_GrenadeCurvature;
		Speed = m_pClient->m_Tuning.m_GrenadeSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_SHOTGUN)
	{
		Curvature = m_pClient->m_Tuning.m_ShotgunCurvature;
		Speed = m_pClient->m_Tuning.m_ShotgunSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_GUN)
	{
		Curvature = m_pClient->m_Tuning.m_GunCurvature;
		Speed = m_pClient->m_Tuning.m_GunSpeed;
	}

	static float s_LastGameTickTime = Client()->GameTickTime();
	if(!m_pClient->IsWorldPaused() && !m_pClient->IsDemoPlaybackPaused())
		s_LastGameTickTime = Client()->GameTickTime();

	float Ct;
	if(m_pClient->ShouldUsePredicted() && Config()->m_ClPredictProjectiles)
		Ct = ((float)(Client()->PredGameTick() - 1 - pCurrent->m_StartTick) + Client()->PredIntraGameTick())/(float)SERVER_TICK_SPEED;
	else
		Ct = (Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED + s_LastGameTickTime;
	if(Ct < 0)
	{
		if(Ct > -s_LastGameTickTime / 2)
		{
			// Fixup the timing which might be screwed during demo playback because
			// s_LastGameTickTime depends on the system timer, while the other part
			// Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED
			// is virtually constant (for projectiles fired on the current game tick):
			// (x - (x+2)) / 50 = -0.04
			//
			// We have a strict comparison for the passed time being more than the time between ticks
			// if(CurtickStart > m_Info.m_CurrentTime) in CDemoPlayer::Update()
			// so on the practice the typical value of s_LastGameTickTime varies from 0.02386 to 0.03999
			// which leads to Ct from -0.00001 to -0.01614.
			// Round up those to 0.0 to fix missing rendering of the projectile.
			Ct = 0;
		}
		else
		{
			return; // projectile haven't been shot yet
		}
	}

	vec2 StartPos(pCurrent->m_X, pCurrent->m_Y);
	vec2 StartVel(pCurrent->m_VelX/100.0f, pCurrent->m_VelY/100.0f);
	vec2 Pos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct);
	vec2 PrevPos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct-0.001f);

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();

	RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[clamp(pCurrent->m_Type, 0, NUM_WEAPONS-1)].m_pSpriteProj);
	const vec2 Vel = Pos-PrevPos;

	// add particle for this projectile
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		m_pClient->m_pEffects->SmokeTrail(Pos, Vel*-1);
		const float Now = Client()->LocalTime();
		static float s_Time = 0.0f;
		static float s_LastLocalTime = Now;
		s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		Graphics()->QuadsSetRotation(s_Time*pi*2*2 + ItemID);
		s_LastLocalTime = Now;
	}
	else
	{
		m_pClient->m_pEffects->BulletTrail(Pos);
		Graphics()->QuadsSetRotation(length(Vel) > 0.00001f ? angle(Vel) : 0);
	}

	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 32, 32);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}